

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> * __thiscall
llvm::DWARFUnit::determineStringOffsetsTableContribution
          (Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *__return_storage_ptr__
          ,DWARFUnit *this,DWARFDataExtractor *DA)

{
  undefined1 auVar1 [8];
  Optional<llvm::DWARFFormValue> *pOVar2;
  OptionalStorage<unsigned_long,_true> OVar3;
  DWARFDie local_78;
  undefined1 auStack_68 [8];
  Expected<llvm::StrOffsetsContributionDescriptor> DescOrError;
  bool local_38;
  Error local_30;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 Offset;
  
  if (this->IsDWO == true) {
    if ((DA->super_DataExtractor).Data.Data == (char *)0x0) {
LAB_00b1387d:
      __return_storage_ptr__->field_0x20 = __return_storage_ptr__->field_0x20 & 0xfe;
      (__return_storage_ptr__->field_0).TStorage.buffer[0] = '\0';
      (__return_storage_ptr__->field_0).TStorage.buffer[0x18] = '\0';
      return __return_storage_ptr__;
    }
    Offset.value = 0;
  }
  else {
    local_78 = getUnitDIE(this,true);
    pOVar2 = DWARFDie::find((Optional<llvm::DWARFFormValue> *)auStack_68,&local_78,
                            DW_AT_str_offsets_base);
    if (local_38 == true) {
      OVar3 = (OptionalStorage<unsigned_long,_true>)
              DWARFFormValue::getAsSectionOffset((DWARFFormValue *)auStack_68);
      Offset = OVar3.field_0;
    }
    else {
      OVar3._8_8_ = 0;
      OVar3.field_0 = (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)pOVar2;
      Offset.value = 0;
    }
    if (((undefined1  [16])OVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_00b1387d;
  }
  parseDWARFStringOffsetsTableHeader
            ((Expected<llvm::StrOffsetsContributionDescriptor> *)auStack_68,DA,
             (this->Header).FormParams.Format,Offset.value);
  auVar1 = auStack_68;
  if ((DescOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
    __return_storage_ptr__->field_0x20 = __return_storage_ptr__->field_0x20 & 0xfe;
    *(undefined1 (*) [8])&__return_storage_ptr__->field_0 = auStack_68;
    *(AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
      *)((AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
          *)((long)&__return_storage_ptr__->field_0 + 8))->buffer =
         DescOrError.field_0.ErrorStorage.buffer;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = DescOrError.field_0._8_8_;
    (__return_storage_ptr__->field_0).TStorage.buffer[0x18] = '\x01';
  }
  else {
    auStack_68 = (undefined1  [8])0x0;
    local_30.Payload = (ErrorInfoBase *)((ulong)auVar1 | 1);
    Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::Expected
              (__return_storage_ptr__,&local_30);
    if ((long *)((ulong)local_30.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_30.Payload & 0xfffffffffffffffe) + 8))();
    }
  }
  if (((DescOrError.field_0.TStorage.buffer[0x10] & 1U) != 0) &&
     (auStack_68 != (undefined1  [8])0x0)) {
    (**(code **)(*(long *)auStack_68 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<Optional<StrOffsetsContributionDescriptor>>
DWARFUnit::determineStringOffsetsTableContribution(DWARFDataExtractor &DA) {
  uint64_t Offset;
  if (IsDWO) {
    Offset = 0;
    if (DA.getData().data() == nullptr)
      return None;
  } else {
    auto OptOffset = toSectionOffset(getUnitDIE().find(DW_AT_str_offsets_base));
    if (!OptOffset)
      return None;
    Offset = *OptOffset;
  }
  auto DescOrError = parseDWARFStringOffsetsTableHeader(DA, Header.getFormat(), Offset);
  if (!DescOrError)
    return DescOrError.takeError();
  return *DescOrError;
}